

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderUintPrecisionCase::~ShaderUintPrecisionCase
          (ShaderUintPrecisionCase *this)

{
  ShaderUintPrecisionCase *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderUintPrecisionCase_0329aab0;
  deinit(this);
  de::Random::~Random(&this->m_rnd);
  std::__cxx11::string::~string((string *)&this->m_op);
  gles3::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

ShaderUintPrecisionCase::~ShaderUintPrecisionCase (void)
{
	ShaderUintPrecisionCase::deinit();
}